

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadStringFallback
          (CodedInputStream *this,string *buffer,int size)

{
  uint8 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  if (buffer->_M_string_length != 0) {
    buffer->_M_string_length = 0;
    *(buffer->_M_dataplus)._M_p = '\0';
  }
  do {
    iVar4 = size;
    puVar1 = this->buffer_;
    iVar3 = (int)this->buffer_end_ - (int)puVar1;
    if (iVar4 - iVar3 == 0 || iVar4 < iVar3) {
      std::__cxx11::string::append((char *)buffer,(ulong)puVar1);
      this->buffer_ = this->buffer_ + iVar4;
      break;
    }
    size = iVar4;
    if (iVar3 != 0) {
      std::__cxx11::string::append((char *)buffer,(ulong)puVar1);
      this->buffer_ = this->buffer_ + iVar3;
      size = iVar4 - iVar3;
    }
    bVar2 = Refresh(this);
  } while (bVar2);
  return iVar4 <= iVar3;
}

Assistant:

bool CodedInputStream::ReadStringFallback(string* buffer, int size) {
  if (!buffer->empty()) {
    buffer->clear();
  }

  int current_buffer_size;
  while ((current_buffer_size = BufferSize()) < size) {
    // Some STL implementations "helpfully" crash on buffer->append(NULL, 0).
    if (current_buffer_size != 0) {
      // Note:  string1.append(string2) is O(string2.size()) (as opposed to
      //   O(string1.size() + string2.size()), which would be bad).
      buffer->append(reinterpret_cast<const char*>(buffer_),
                     current_buffer_size);
    }
    size -= current_buffer_size;
    Advance(current_buffer_size);
    if (!Refresh()) return false;
  }

  buffer->append(reinterpret_cast<const char*>(buffer_), size);
  Advance(size);

  return true;
}